

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

int __thiscall
RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles
          (RuntimeObjectSystem *this,ITestBuildNotifier *callback,bool bTestFileTracking)

{
  ICompilerLogger *pIVar1;
  int iVar2;
  int iVar3;
  pointer *ppPVar4;
  pointer pPVar5;
  long lVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  Path *file;
  pointer this_00;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  TFileList filesToTest;
  vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> local_68;
  string local_50;
  
  uVar9 = CONCAT71(in_register_00000011,bTestFileTracking) & 0xffffffff;
  uVar13 = (uint)CONCAT71(in_register_00000011,bTestFileTracking);
  pIVar1 = this->m_pCompilerLogger;
  if (pIVar1 != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"TestBuildAllRuntimeSourceFiles Starting\n");
  }
  if (callback == (ITestBuildNotifier *)0x0) {
    callback = (ITestBuildNotifier *)this;
  }
  pPVar5 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->m_Projects).
                super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5;
  if (lVar6 == 0) {
    bVar14 = true;
  }
  else {
    uVar7 = (lVar6 >> 3) * -0x7dc11f7047dc11f7;
    ppPVar4 = &(pPVar5->m_RuntimeFileList).
               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 1;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + ((long)*ppPVar4 - (long)((_Vector_impl_data *)(ppPVar4 + -1))->_M_start >> 3)
                      * -0x3333333333333333;
      uVar11 = uVar8 & 0xffff;
      ppPVar4 = ppPVar4 + 0x39;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar11 <= uVar7 && uVar7 - uVar11 != 0);
    bVar14 = lVar6 == 0;
  }
  if (bVar14) {
    (*(((RuntimeObjectSystem *)callback)->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
      _vptr_ITestBuildNotifier[2])(callback,0,1);
  }
  pPVar5 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar15 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_finish == pPVar5;
  bVar14 = !bVar15;
  if (bVar15) {
    uVar12 = 0;
  }
  else {
    uVar7 = 0;
    uVar10 = 0;
    uVar12 = 0;
    do {
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
                (&local_68,&pPVar5[uVar7].m_RuntimeFileList);
      for (this_00 = local_68.
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar15 = this_00 !=
                   local_68.
                   super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                   ._M_impl.super__Vector_impl_data._M_finish, bVar15; this_00 = this_00 + 1) {
        FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,this_00);
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 == 0) {
          bVar16 = true;
        }
        else {
          iVar3 = TestBuildFile(this->m_pCompilerLogger,this,this_00,callback,bTestFileTracking);
          iVar2 = iVar3;
          if (iVar3 == -0xd1e) {
            iVar2 = 0;
          }
          uVar13 = uVar12 - iVar2;
          bVar16 = -1 < iVar3;
          uVar12 = iVar3 + uVar12;
          if (!bVar16) {
            uVar9 = (ulong)uVar13;
            uVar12 = uVar13;
          }
        }
        if (!bVar16) break;
      }
      uVar13 = (uint)uVar9;
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector(&local_68)
      ;
      if (bVar15) break;
      uVar10 = uVar10 + 1;
      uVar7 = (ulong)(uVar10 & 0xffff);
      pPVar5 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) *
              -0x7dc11f7047dc11f7;
      bVar15 = uVar8 - uVar7 != 0;
      bVar14 = uVar7 <= uVar8 && bVar15;
    } while (uVar7 <= uVar8 && bVar15);
  }
  if (!bVar14) {
    pIVar1 = this->m_pCompilerLogger;
    uVar13 = uVar12;
    if (uVar12 == 0) {
      if (pIVar1 != (ICompilerLogger *)0x0) {
        (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"All Tests Passed\n");
      }
    }
    else if (pIVar1 != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)pIVar1)(pIVar1,"Tests Failed: %d\n",uVar12);
    }
  }
  return uVar13;
}

Assistant:

int RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles(  ITestBuildNotifier* callback, bool bTestFileTracking )
{
    if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("TestBuildAllRuntimeSourceFiles Starting\n"); }
   
    ITestBuildNotifier* failCallbackLocal = callback;
    if( !failCallbackLocal )
    {
        failCallbackLocal = this;
    }

    int numErrors = 0;

    size_t numFilesToBuild = 0;
    for( unsigned short proj = 0; proj < m_Projects.size( ); ++proj )
    {
        numFilesToBuild += m_Projects[ proj ].m_RuntimeFileList.size( );
    }

    if( 0 == numFilesToBuild )
    {
        failCallbackLocal->TestBuildCallback( NULL, TESTBUILDRRESULT_NO_FILES_TO_BUILD );
    }
    
    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {
        TFileList filesToTest = m_Projects[ proj ].m_RuntimeFileList; // m_RuntimeFileList could change if file content changes (new includes or source dependencies) so make copy to ensure iterators valid.
        for( TFileList::iterator it = filesToTest.begin(); it != filesToTest.end(); ++it )
        {
            const Path& file = *it;
            if( file.Extension() != ".h" ) // exclude headers, use TestBuildAllRuntimeHeaders
            {
                int fileErrors = TestBuildFile( m_pCompilerLogger, this, file, failCallbackLocal, bTestFileTracking );
                if( fileErrors < 0 )
                {
                    // this means exit, and the number of errors is -ve so remove, unless -0xD1E is the response (for no error die)
                    if( fileErrors != -0xD1E )
                    {
                        numErrors -= fileErrors;
                    }
                    return numErrors;
                }
                numErrors += fileErrors;
            }
        }
    }

    if( 0 == numErrors )
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("All Tests Passed\n"); }
    }
    else
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("Tests Failed: %d\n", numErrors); }
    }
    return numErrors;
}